

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TGAImage.h
# Opt level: O1

void __thiscall TRM::TGAColor::TGAColor(TGAColor *this,uchar *p,uchar bpp)

{
  uchar uVar1;
  ulong uVar2;
  undefined7 in_register_00000011;
  
  this->bgra[0] = '\0';
  this->bgra[1] = '\0';
  this->bgra[2] = '\0';
  this->bgra[3] = '\0';
  this->bytespp = bpp;
  if ((int)CONCAT71(in_register_00000011,bpp) != 0) {
    uVar2 = 0;
    do {
      this->bgra[uVar2] = p[uVar2];
      uVar2 = uVar2 + 1;
    } while (bpp != uVar2);
  }
  if (bpp < 4) {
    memset(this->bgra + bpp,0,(ulong)(byte)(4 - bpp));
  }
  uVar1 = this->bgra[0];
  this->bgra[0] = this->bgra[2];
  this->bgra[2] = uVar1;
  return;
}

Assistant:

TGAColor(const unsigned char *p, unsigned char bpp) : bgra(), bytespp(bpp) {
    for (int i = 0; i < (int)bpp; i++) {
      bgra[i] = p[i];
    }
    for (int i = bpp; i < 4; i++) {
      bgra[i] = 0;
    }
    std::swap(bgra[0], bgra[2]);
  }